

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

int __thiscall
kratos::IfStmt::clone(IfStmt *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  shared_ptr<kratos::Stmt> local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  shared_ptr<kratos::Stmt> else_clone;
  undefined1 local_38 [8];
  shared_ptr<kratos::Stmt> then_clone;
  shared_ptr<kratos::IfStmt> if_;
  IfStmt *this_local;
  
  std::make_shared<kratos::IfStmt,std::shared_ptr<kratos::Var>const&>
            ((shared_ptr<kratos::Var> *)
             &then_clone.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar2 = std::
           __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(__fn + 0xe0));
  (*(peVar2->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xb])(local_38);
  peVar2 = std::
           __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(__fn + 0xf0));
  (*(peVar2->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xb])(local_58);
  std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_38
            );
  Stmt::as<kratos::ScopedStmtBlock>((Stmt *)local_68);
  p_Var1 = &then_clone.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  peVar3 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)p_Var1);
  std::shared_ptr<kratos::ScopedStmtBlock>::operator=
            (&peVar3->then_body_,(shared_ptr<kratos::ScopedStmtBlock> *)local_68);
  std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::ScopedStmtBlock> *)local_68);
  peVar3 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)p_Var1);
  peVar2 = std::
           __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&peVar3->then_body_);
  peVar4 = std::__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)p_Var1);
  (*(peVar2->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[7])(peVar2,peVar4);
  std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_58
            );
  Stmt::as<kratos::ScopedStmtBlock>((Stmt *)local_78);
  p_Var1 = &then_clone.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  peVar3 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)p_Var1);
  std::shared_ptr<kratos::ScopedStmtBlock>::operator=
            (&peVar3->else_body_,(shared_ptr<kratos::ScopedStmtBlock> *)local_78);
  std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::ScopedStmtBlock> *)local_78);
  peVar3 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)p_Var1);
  peVar2 = std::
           __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&peVar3->else_body_);
  peVar4 = std::__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)p_Var1);
  (*(peVar2->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[7])(peVar2,peVar4);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::IfStmt,void>
            (&local_88,
             (shared_ptr<kratos::IfStmt> *)
             &then_clone.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Stmt::copy_meta((Stmt *)__fn,&local_88);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_88);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::IfStmt,void>
            ((shared_ptr<kratos::Stmt> *)this,
             (shared_ptr<kratos::IfStmt> *)
             &then_clone.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)local_58);
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)local_38);
  std::shared_ptr<kratos::IfStmt>::~shared_ptr
            ((shared_ptr<kratos::IfStmt> *)
             &then_clone.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return (int)this;
}

Assistant:

std::shared_ptr<Stmt> IfStmt::clone() const {
    auto if_ = std::make_shared<IfStmt>(predicate_);
    auto then_clone = then_body_->clone();
    auto else_clone = else_body_->clone();

    if_->then_body_ = then_clone->as<ScopedStmtBlock>();
    if_->then_body_->set_parent(if_.get());
    if_->else_body_ = else_clone->as<ScopedStmtBlock>();
    if_->else_body_->set_parent(if_.get());

    copy_meta(if_);

    return if_;
}